

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugins.h
# Opt level: O0

void __thiscall
f8n::plugin::Plugins::QueryFunction<void(*)(f8n::sdk::IPreferences*)>
          (Plugins *this,string *functionName,
          function<void_(f8n::sdk::IPlugin_*,_void_(*)(f8n::sdk::IPreferences_*))> *handler)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  reference psVar4;
  element_type *peVar5;
  undefined8 uVar6;
  element_type *peVar7;
  _func_void_IPreferences_ptr *__args_1;
  _func_void_IPreferences_ptr *funcPtr;
  undefined1 local_58 [8];
  shared_ptr<f8n::plugin::Plugins::Descriptor> descriptor;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
  *__range3;
  unique_lock<std::mutex> lock;
  function<void_(f8n::sdk::IPlugin_*,_void_(*)(f8n::sdk::IPreferences_*))> *handler_local;
  string *functionName_local;
  Plugins *this_local;
  
  lock._8_8_ = handler;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&__range3,&this->mutex);
  __end3 = std::
           vector<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
           ::begin(&this->plugins);
  descriptor.super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>
       ::end(&this->plugins);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_*,_std::vector<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>_>
                                     *)&descriptor.
                                        super___shared_ptr<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar2) {
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_*,_std::vector<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>_>
             ::operator*(&__end3);
    std::shared_ptr<f8n::plugin::Plugins::Descriptor>::shared_ptr
              ((shared_ptr<f8n::plugin::Plugins::Descriptor> *)local_58,psVar4);
    peVar5 = std::
             __shared_ptr_access<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<f8n::sdk::IPreferences,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->prefs);
    std::
    __shared_ptr_access<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_58);
    uVar6 = std::__cxx11::string::c_str();
    uVar3 = (*peVar5->_vptr_IPreferences[1])(peVar5,uVar6,1);
    if ((uVar3 & 1) != 0) {
      peVar7 = std::
               __shared_ptr_access<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      pvVar1 = peVar7->nativeHandle;
      uVar6 = std::__cxx11::string::c_str();
      __args_1 = (_func_void_IPreferences_ptr *)dlsym(pvVar1,uVar6);
      if (__args_1 != (_func_void_IPreferences_ptr *)0x0) {
        peVar7 = std::
                 __shared_ptr_access<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<f8n::plugin::Plugins::Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58);
        std::function<void_(f8n::sdk::IPlugin_*,_void_(*)(f8n::sdk::IPreferences_*))>::operator()
                  (handler,peVar7->plugin,__args_1);
      }
    }
    std::shared_ptr<f8n::plugin::Plugins::Descriptor>::~shared_ptr
              ((shared_ptr<f8n::plugin::Plugins::Descriptor> *)local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_*,_std::vector<std::shared_ptr<f8n::plugin::Plugins::Descriptor>,_std::allocator<std::shared_ptr<f8n::plugin::Plugins::Descriptor>_>_>_>
    ::operator++(&__end3);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__range3);
  return;
}

Assistant:

void QueryFunction(
                const std::string& functionName,
                std::function<void(f8n::sdk::IPlugin*, T)> handler)
            {
                std::unique_lock<std::mutex> lock(this->mutex);

                for (std::shared_ptr<Descriptor> descriptor : this->plugins) {
                    if (prefs->GetBool(descriptor->key.c_str(), true)) { /* if enabled by prefs */
                        T funcPtr =
#ifdef WIN32
                            (T) GetProcAddress((HMODULE)(descriptor->nativeHandle), functionName.c_str());
#else
                            (T)dlsym(descriptor->nativeHandle, functionName.c_str());
#endif
                        if (funcPtr) {
                            handler(descriptor->plugin, funcPtr);
                        }
                    }
                }
            }